

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

uint TtfUtil::Cmap310NextCodepoint(void *pCmap310,uint nUnicodeId,int *pRangeKey)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 *in_RDX;
  uint in_ESI;
  uint nEndCode;
  uint nStartCode;
  int iRange;
  uint32 nUnicodePrev;
  int nRange;
  CmapSubTableFormat12 *pTable;
  uint32 local_48;
  uint32 local_40;
  uint32 local_34;
  uint local_30;
  uint32 local_4;
  
  uVar2 = read<unsigned_int>(0);
  if (in_ESI == 0) {
    if (in_RDX != (uint32 *)0x0) {
      *in_RDX = 0;
    }
    local_4 = read<unsigned_int>(0);
  }
  else if (in_ESI < 0x10ffff) {
    if (in_RDX == (uint32 *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = *in_RDX;
    }
    local_34 = local_40;
    while( true ) {
      bVar1 = false;
      if (0 < (int)local_34) {
        uVar3 = read<unsigned_int>(0);
        bVar1 = in_ESI < uVar3;
      }
      if (!bVar1) break;
      local_34 = local_34 - 1;
    }
    while (uVar3 = read<unsigned_int>(0), uVar3 < in_ESI) {
      local_34 = local_34 + 1;
    }
    uVar3 = read<unsigned_int>(0);
    uVar4 = read<unsigned_int>(0);
    local_30 = in_ESI;
    if (in_ESI < uVar3) {
      local_30 = uVar3 - 1;
    }
    if (local_30 < uVar4) {
      if (in_RDX != (uint32 *)0x0) {
        *in_RDX = local_34;
      }
      local_4 = local_30 + 1;
    }
    else {
      if (in_RDX != (uint32 *)0x0) {
        *in_RDX = local_34 + 1;
      }
      if ((int)(local_34 + 1) < (int)uVar2) {
        local_48 = read<unsigned_int>(0);
      }
      else {
        local_48 = 0x10ffff;
      }
      local_4 = local_48;
    }
  }
  else {
    if (in_RDX != (uint32 *)0x0) {
      *in_RDX = uVar2;
    }
    local_4 = 0x10ffff;
  }
  return local_4;
}

Assistant:

unsigned int Cmap310NextCodepoint(const void *pCmap310, unsigned int nUnicodeId, int * pRangeKey)
{
	const Sfnt::CmapSubTableFormat12 * pTable = reinterpret_cast<const Sfnt::CmapSubTableFormat12 *>(pCmap310);

	int nRange = read(pTable->num_groups);

	uint32 nUnicodePrev = (uint32)nUnicodeId;

	if (nUnicodePrev == 0)
	{
		// return the first codepoint.
		if (pRangeKey)
			*pRangeKey = 0;
		return read(pTable->group[0].start_char_code);
	}
	else if (nUnicodePrev >= 0x10FFFF)
	{
		if (pRangeKey)
			*pRangeKey = nRange;
		return 0x10FFFF;
	}

	int iRange = (pRangeKey) ? *pRangeKey : 0;
	// Just in case we have a bad key:
	while (iRange > 0 && read(pTable->group[iRange].start_char_code) > nUnicodePrev)
		iRange--;
	while (read(pTable->group[iRange].end_char_code) < nUnicodePrev)
		iRange++;

	// Now iRange is the range containing nUnicodePrev.

	unsigned int nStartCode = read(pTable->group[iRange].start_char_code);
	unsigned int nEndCode = read(pTable->group[iRange].end_char_code);

	if (nStartCode > nUnicodePrev)
		// Oops, nUnicodePrev is not in the cmap! Adjust so we get a reasonable
		// answer this time around.
		nUnicodePrev = nStartCode - 1;

	if (nEndCode > nUnicodePrev)
	{
		// Next is in the same range; it is the next successive codepoint.
		if (pRangeKey)
			*pRangeKey = iRange;
		return nUnicodePrev + 1;
	}

	// Otherwise the next codepoint is the first one in the next range, or 10FFFF if we're done.
	if (pRangeKey)
		*pRangeKey = iRange + 1;
	return (iRange + 1 >= nRange) ? 0x10FFFF : read(pTable->group[iRange + 1].start_char_code);
}